

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

wchar_t format_small_keypad_key
                  (char *buf,Terminal *term,SmallKeypadKey key,_Bool shift,_Bool ctrl,_Bool alt,
                  _Bool *consumed_alt)

{
  char cVar1;
  int iVar2;
  wchar_t wVar3;
  int iVar4;
  char *pcVar5;
  uint uVar6;
  
  if (SKK_PGDN < key) {
    __assert_fail("false && \"bad small keypad key enum value\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                  ,0x1d46,
                  "int format_small_keypad_key(char *, Terminal *, SmallKeypadKey, _Bool, _Bool, _Bool, _Bool *)"
                 );
  }
  uVar6 = *(uint *)(&DAT_0011ff7c + (ulong)key * 4);
  wVar3 = term->funky_type;
  if (wVar3 == L'\x03') {
    uVar6 = (uint)""[uVar6];
  }
  iVar4 = (int)buf;
  if ((term->vt52_mode == true) && (uVar6 - 1 < 6)) {
    cVar1 = " HLMEIG"[uVar6];
    pcVar5 = "\x1b%c";
LAB_0010ebba:
    uVar6 = (uint)cVar1;
LAB_0010ebbd:
    iVar2 = sprintf(buf,pcVar5,(ulong)uVar6);
  }
  else {
    if (wVar3 == L'\x05') {
      if (uVar6 == 3) {
        iVar2 = iVar4 + 1;
        *buf = '\x7f';
        goto LAB_0010ebc9;
      }
      cVar1 = " HLMEIG"[(long)(int)uVar6 + 7];
      pcVar5 = "\x1b[%c";
      goto LAB_0010ebba;
    }
    if (((uVar6 != 4) && (uVar6 != 1)) || (term->rxvt_homeend != true)) {
      if ((term->vt52_mode == false) && (wVar3 == L'\x06')) {
        wVar3 = shift_bitmap(shift,ctrl,alt,consumed_alt);
        if (wVar3 != L'\0') {
          iVar2 = sprintf(buf,"\x1b[%d;%d~",(ulong)uVar6,(ulong)(uint)wVar3);
          goto LAB_0010ebc4;
        }
      }
      pcVar5 = "\x1b[%d~";
      goto LAB_0010ebbd;
    }
    pcVar5 = "\x1bOw";
    if (uVar6 == 1) {
      pcVar5 = "\x1b[H";
    }
    iVar2 = sprintf(buf,pcVar5);
  }
LAB_0010ebc4:
  iVar2 = iVar2 + iVar4;
LAB_0010ebc9:
  return iVar2 - iVar4;
}

Assistant:

int format_small_keypad_key(char *buf, Terminal *term, SmallKeypadKey key,
                            bool shift, bool ctrl, bool alt,
                            bool *consumed_alt)
{
    char *p = buf;

    int code;
    switch (key) {
      case SKK_HOME: code = 1; break;
      case SKK_INSERT: code = 2; break;
      case SKK_DELETE: code = 3; break;
      case SKK_END: code = 4; break;
      case SKK_PGUP: code = 5; break;
      case SKK_PGDN: code = 6; break;
      default: unreachable("bad small keypad key enum value");
    }

    /* Reorder edit keys to physical order */
    if (term->funky_type == FUNKY_VT400 && code <= 6)
        code = "\0\2\1\4\5\3\6"[code];

    if (term->vt52_mode && code > 0 && code <= 6) {
        p += sprintf(p, "\x1B%c", " HLMEIG"[code]);
    } else if (term->funky_type == FUNKY_SCO) {
        static const char codes[] = "HL.FIG";
        if (code == 3) {
            *p++ = '\x7F';
        } else {
            p += sprintf(p, "\x1B[%c", codes[code-1]);
        }
    } else if ((code == 1 || code == 4) && term->rxvt_homeend) {
        p += sprintf(p, code == 1 ? "\x1B[H" : "\x1BOw");
    } else {
        if (term->vt52_mode) {
	    p += sprintf(p, "\x1B[%d~", code);
        } else {
            int bitmap = 0;
            if (term->funky_type == FUNKY_XTERM_216)
                bitmap = shift_bitmap(shift, ctrl, alt, consumed_alt);
            if (bitmap)
                p += sprintf(p, "\x1B[%d;%d~", code, bitmap);
            else
                p += sprintf(p, "\x1B[%d~", code);
        }
    }

    return p - buf;
}